

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_function_queue.h
# Opt level: O2

optional<double> __thiscall
density::
lf_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
::try_reentrant_consume_impl
          (lf_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
           *this,lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
                 *param_2)

{
  double dVar1;
  bool bVar2;
  FunctionRuntimeType<(density::function_type_erasure)0,_double_()> *pFVar3;
  void *pvVar4;
  undefined8 extraout_RDX;
  optional<double> oVar5;
  reentrant_consume_operation cons;
  reentrant_consume_operation local_30;
  
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::try_start_reentrant_consume(&local_30,param_2);
  bVar2 = lf_heter_queue::reentrant_consume_operation::operator_cast_to_bool
                    ((reentrant_consume_operation *)&local_30);
  if (bVar2) {
    pFVar3 = lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
             ::reentrant_consume_operation::complete_type(&local_30);
    pvVar4 = lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
             ::reentrant_consume_operation::unaligned_element_ptr(&local_30);
    dVar1 = (*pFVar3->m_align_invoke_destroy)(pvVar4);
    lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
    ::reentrant_consume_operation::commit_nodestroy(&local_30);
    *(undefined1 *)
     &(this->m_queue).
      super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
      .
      super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
      .m_initial_page._M_b._M_p = 1;
    (this->m_queue).
    super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
    .
    super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
    .m_tail.super___atomic_base<unsigned_long>._M_i = (__int_type)dVar1;
  }
  else {
    (this->m_queue).
    super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
    .
    super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
    .m_tail.super___atomic_base<unsigned_long>._M_i = 0;
    (this->m_queue).
    super_LFQueue_Head<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>_>
    .
    super_LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
    .m_initial_page._M_b._M_p = (__pointer_type)0x0;
  }
  lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
  ::reentrant_consume_operation::~reentrant_consume_operation(&local_30);
  oVar5._8_8_ = extraout_RDX;
  oVar5.m_storage = (type)this;
  return oVar5;
}

Assistant:

optional<RET_VAL> try_reentrant_consume_impl(std::false_type, PARAMS... i_params)
        {
            if (auto cons = m_queue.try_start_reentrant_consume())
            {
                auto && result = cons.complete_type().align_invoke_destroy(
                  cons.unaligned_element_ptr(), std::forward<PARAMS>(i_params)...);
                cons.commit_nodestroy();
                return optional<RET_VAL>(std::move(result));
            }
            else
            {
                return optional<RET_VAL>();
            }
        }